

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
directed_flag_complex_in_memory_computer_t
          (directed_flag_complex_in_memory_computer_t *this,filtered_directed_graph_t *_graph,
          flagser_parameters *params)

{
  byte bVar1;
  pointer pfVar2;
  undefined8 uVar3;
  undefined2 *in_RDX;
  directed_graph_t *in_RSI;
  undefined8 *in_RDI;
  size_t unaff_retaddr;
  directed_graph_t *in_stack_00000008;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_00000010;
  size_t in_stack_00000148;
  filtration_algorithm_t *in_stack_00000150;
  filtered_directed_graph_t *in_stack_00000158;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_00000160;
  value_type_conflict3 *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  allocator_type *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
  *in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  *in_RDI = in_RSI;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  pfVar2 = std::unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>::
           get((unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  in_RDI[5] = pfVar2;
  *(undefined2 *)(in_RDI + 6) = in_RDX[1];
  *(undefined2 *)((long)in_RDI + 0x32) = *in_RDX;
  uVar3 = std::__cxx11::string::c_str();
  in_RDI[7] = uVar3;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined1 *)((long)in_RDI + 0x44) = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b4f5e);
  in_RDI[0xc] = *(undefined8 *)(in_RDX + 0xc);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1b4f81);
  std::allocator<compressed_sparse_matrix<entry_t>_>::allocator
            ((allocator<compressed_sparse_matrix<entry_t>_> *)0x1b4fad);
  std::
  vector<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>::
  vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<compressed_sparse_matrix<entry_t>_>::~allocator
            ((allocator<compressed_sparse_matrix<entry_t>_> *)0x1b4fd0);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x13);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1b500b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,in_stack_ffffffffffffff58,(value_type_conflict3 *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1b5036);
  *(undefined2 *)(in_RDI + 0x16) = in_RDX[2];
  directed_graph_t::vertex_number(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  directed_graph_t::edge_number((directed_graph_t *)0x1b509e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  if ((*(ushort *)(in_RDI + 6) < 2) ||
     ((in_RDI[5] != 0 && (bVar1 = (**(code **)(*(long *)in_RDI[5] + 0x28))(), (bVar1 & 1) != 0)))) {
    prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
              (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
  }
  return;
}

Assistant:

directed_flag_complex_in_memory_computer_t(filtered_directed_graph_t& _graph, const flagser_parameters& params)
	    : graph(_graph), flag_complex(graph, params.nb_threads),
	      filtration_algorithm(params.filtration_algorithm.get()), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), cache(params.cache.c_str()), nb_threads(params.nb_threads),
	      coboundary_matrix(nb_threads), coboundary_matrix_offsets(nb_threads, 0), modulus(params.modulus) {
		cell_count.push_back(_graph.vertex_number());
		cell_count.push_back(_graph.edge_number());

		// Order the edges and compute the correct filtration
		if (min_dimension <= 1 || (filtration_algorithm != nullptr && filtration_algorithm->needs_face_filtration()))
			prepare_graph_filtration(flag_complex, graph, filtration_algorithm, nb_threads);
	}